

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

string * to_hex_string_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  anon_union_8_2_94730070 v;
  stringstream ss;
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<((ostream *)local_1a0,"0x");
  lVar2 = 8;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
    poVar1 = std::operator<<((ostream *)local_1a0,0x30);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 0x4000;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex_string(double d) {
    std::stringstream ss;
    ss << "0x";
    union {
        double d;
        unsigned char s[8];
    } v;
    v.d = d;
    for (int i = 0; i < 8; ++i) {
        ss << std::hex 
            << std::setw(2) 
            << std::setfill('0') 
            << std::uppercase 
            << (unsigned)v.s[7-i];
    }
    return ss.str();
}